

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-stack.cpp
# Opt level: O3

void __thiscall wasm::BinaryInstWriter::visitIf(BinaryInstWriter *this,If *curr)

{
  pointer *ppNVar1;
  iterator __position;
  undefined8 uVar2;
  uchar local_19;
  
  uVar2 = IMPOSSIBLE_CONTINUE._8_8_;
  __position._M_current =
       (this->breakStack).super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (__position._M_current ==
      (this->breakStack).super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<wasm::Name,std::allocator<wasm::Name>>::_M_realloc_insert<wasm::Name&>
              ((vector<wasm::Name,std::allocator<wasm::Name>> *)&this->breakStack,__position,
               (Name *)IMPOSSIBLE_CONTINUE);
  }
  else {
    ((__position._M_current)->super_IString).str._M_len = IMPOSSIBLE_CONTINUE._0_8_;
    ((__position._M_current)->super_IString).str._M_str = (char *)uVar2;
    ppNVar1 = &(this->breakStack).super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>.
               _M_impl.super__Vector_impl_data._M_finish;
    *ppNVar1 = *ppNVar1 + 1;
  }
  local_19 = '\x04';
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::emplace_back<unsigned_char>
            (&this->o->super_vector<unsigned_char,_std::allocator<unsigned_char>_>,&local_19);
  emitResultType(this,(Type)(curr->super_SpecificExpression<(wasm::Expression::Id)2>).
                            super_Expression.type.id);
  return;
}

Assistant:

void BinaryInstWriter::visitIf(If* curr) {
  // the binary format requires this; we have a block if we need one
  // TODO: optimize this in Stack IR (if child is a block, we may break to this
  // instead)
  breakStack.emplace_back(IMPOSSIBLE_CONTINUE);
  o << int8_t(BinaryConsts::If);
  emitResultType(curr->type);
}